

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O0

void bson_init(bson_t *bson)

{
  bson_impl_inline_t *impl;
  bson_t *bson_local;
  
  if (bson == (bson_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson.c",
            0x793,"bson_init","bson");
    abort();
  }
  bson->flags = 3;
  bson->len = 5;
  bson->padding[0] = '\x05';
  bson->padding[1] = '\0';
  bson->padding[2] = '\0';
  bson->padding[3] = '\0';
  bson->padding[4] = '\0';
  return;
}

Assistant:

void
bson_init (bson_t *bson)
{
   bson_impl_inline_t *impl = (bson_impl_inline_t *) bson;

   BSON_ASSERT (bson);

   impl->flags = BSON_FLAG_INLINE | BSON_FLAG_STATIC;
   impl->len = 5;
   impl->data[0] = 5;
   impl->data[1] = 0;
   impl->data[2] = 0;
   impl->data[3] = 0;
   impl->data[4] = 0;
}